

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeTripleQuotedString(AsciiParser *this,StringData *str)

{
  ulong uVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  StreamReader *pSVar10;
  int iVar11;
  ulong uVar12;
  char cVar13;
  uint uVar14;
  ulong in_R8;
  int iVar15;
  string s;
  vector<char,_std::allocator<char>_> triple_quote;
  stringstream str_buf;
  stringstream ss;
  int local_3b8;
  int local_3b4;
  int local_3a0;
  bool local_39c;
  string local_398;
  vector<char,_std::allocator<char>_> local_378;
  string local_360;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  uVar5 = this->_sr->idx_;
  iVar3 = (this->_curr_cursor).row;
  iVar4 = (this->_curr_cursor).col;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar7 = CharN(this,3,&local_378);
  if ((bVar7) &&
     ((long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == 3)) {
    if (*local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == '\'') {
      if ((local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start[1] == '\'') &&
         (local_39c = true,
         local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[2] == '\'')) goto LAB_003396df;
    }
    else if ((*local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start == '\"') &&
            ((local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[1] == '\"' &&
             (local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[2] == '\"')))) {
      local_39c = false;
LAB_003396df:
      ::std::__cxx11::stringstream::stringstream(local_340);
      local_3a0 = (this->_curr_cursor).row;
      local_3b8 = (this->_curr_cursor).col;
      pSVar10 = this->_sr;
      uVar9 = pSVar10->length_;
      uVar12 = pSVar10->idx_;
      bVar7 = false;
      if (uVar12 < uVar9) {
        local_3b4 = 0;
        bVar7 = false;
        iVar15 = 0;
        do {
          if (pSVar10->binary_[uVar12] == '\0') break;
          uVar1 = uVar12 + 1;
          if (uVar1 <= uVar9) {
            in_R8 = (ulong)pSVar10->binary_[uVar12];
            pSVar10->idx_ = uVar1;
          }
          uVar14 = (uint)in_R8;
          if (uVar9 < uVar1) {
            cVar13 = '\x01';
            if (uVar5 <= uVar9) {
              pSVar10->idx_ = uVar5;
            }
          }
          else {
            if ((char)in_R8 == '\\') {
              local_398._M_dataplus._M_p = (pointer)0x0;
              local_398._M_string_length = 0;
              local_398.field_2._M_allocated_capacity = 0;
              local_398._M_dataplus._M_p = (pointer)operator_new(3);
              local_398._M_string_length = (size_type)(local_398._M_dataplus._M_p + 3);
              local_398._M_dataplus._M_p[0] = '\0';
              local_398._M_dataplus._M_p[1] = '\0';
              local_398._M_dataplus._M_p[2] = '\0';
              local_398.field_2._M_allocated_capacity = local_398._M_string_length;
              bVar8 = LookCharN(this,3,(vector<char,_std::allocator<char>_> *)&local_398);
              cVar13 = '\0';
              if (bVar8) {
                bVar8 = true;
                if (*local_398._M_dataplus._M_p == '\"') {
                  cVar13 = '\0';
                  if ((local_398._M_dataplus._M_p[1] == '\"') &&
                     (local_398._M_dataplus._M_p[2] == '\"')) {
                    pcVar6 = "\\\"\"\"";
                    goto LAB_0033994a;
                  }
                }
                else if (((*local_398._M_dataplus._M_p == '\'') &&
                         (local_398._M_dataplus._M_p[1] == '\'')) &&
                        (local_398._M_dataplus._M_p[2] == '\'')) {
                  pcVar6 = "\\\'\'\'";
LAB_0033994a:
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_330,pcVar6 + 1,3);
                  pSVar10 = this->_sr;
                  if ((-4 < (long)pSVar10->idx_) &&
                     (uVar9 = pSVar10->idx_ + 3, uVar9 <= pSVar10->length_)) {
                    pSVar10->idx_ = uVar9;
                  }
                  local_3b8 = local_3b8 + 3;
                  cVar13 = '\x02';
                  goto LAB_00339823;
                }
              }
              else {
                cVar13 = '\x01';
LAB_00339823:
                bVar8 = false;
              }
              if (local_398._M_dataplus._M_p != (char *)0x0) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity -
                                (long)local_398._M_dataplus._M_p);
              }
              in_R8 = in_R8 & 0xff;
              uVar14 = (uint)in_R8;
              if (!bVar8) goto LAB_00339a3f;
            }
            cVar13 = (char)uVar14;
            local_398._M_dataplus._M_p._0_1_ = cVar13;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_398,1);
            iVar11 = 0;
            if (cVar13 == '\'') {
              iVar15 = iVar15 + 1;
            }
            else {
              if ((uVar14 & 0xff) == 0x22) {
                iVar11 = local_3b4 + 1;
              }
              iVar15 = 0;
            }
            local_3b8 = local_3b8 + 1;
            local_3b4 = iVar11;
            if (cVar13 == '\r') {
              pSVar10 = this->_sr;
              uVar9 = pSVar10->length_;
              uVar12 = pSVar10->idx_;
              if (uVar9 - 1 <= uVar12) {
LAB_003399d8:
                local_3a0 = local_3a0 + 1;
                local_3b8 = 0;
                goto LAB_003399e4;
              }
              if (uVar12 + 1 <= uVar9) {
                uVar2 = pSVar10->binary_[uVar12];
                pSVar10->idx_ = uVar12 + 1;
                if (uVar2 == '\n') {
                  local_398._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            (local_330,(char *)&local_398,1);
                }
                else {
                  uVar9 = pSVar10->length_;
                  uVar12 = pSVar10->idx_ - 1;
                  if (uVar9 < uVar12 || (long)pSVar10->idx_ < 1) goto LAB_003398f3;
                  pSVar10->idx_ = uVar12;
                }
                goto LAB_003399d8;
              }
LAB_003398f3:
              cVar13 = '\x01';
              if (uVar5 <= uVar9) {
                pSVar10->idx_ = uVar5;
              }
            }
            else {
              if ((uVar14 & 0xff) == 10) goto LAB_003399d8;
LAB_003399e4:
              if ((~local_39c & iVar11 == 3) == 0) {
                cVar13 = (iVar15 == 3 && iVar11 == 0) * '\x03';
                if (iVar15 == 3 && iVar11 == 0) {
                  iVar15 = 3;
                  bVar7 = true;
                }
              }
              else {
                bVar7 = true;
                cVar13 = '\x03';
                local_3b4 = 3;
              }
            }
            in_R8 = (ulong)uVar14;
          }
LAB_00339a3f:
          if ((cVar13 != '\0') && (cVar13 != '\x02')) {
            if (cVar13 != '\x03') goto LAB_00339b92;
            break;
          }
          pSVar10 = this->_sr;
          uVar9 = pSVar10->length_;
          uVar12 = pSVar10->idx_;
        } while (uVar12 < uVar9);
      }
      if (bVar7) {
        str->single_quote = local_39c;
        ::std::__cxx11::stringbuf::str();
        if ((char *)0x3 < local_398._M_string_length) {
          (local_398._M_dataplus._M_p + -3)[local_398._M_string_length] = '\0';
          local_398._M_string_length = (size_type)(local_398._M_string_length + -3);
        }
        unescapeControlSequence(&local_360,&local_398);
        ::std::__cxx11::string::operator=((string *)str,(string *)&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        str->line_col = iVar4;
        str->line_row = iVar3;
        str->is_triple_quoted = true;
        (this->_curr_cursor).row = local_3a0;
        (this->_curr_cursor).col = local_3b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,
                          (ulong)(local_398.field_2._M_allocated_capacity + 1));
        }
        bVar7 = true;
      }
      else {
        if (uVar5 <= this->_sr->length_) {
          this->_sr->idx_ = uVar5;
        }
LAB_00339b92:
        bVar7 = false;
      }
      ::std::__cxx11::stringstream::~stringstream(local_340);
      ::std::ios_base::~ios_base(local_2c0);
      goto LAB_00339a73;
    }
  }
  if (uVar5 <= this->_sr->length_) {
    this->_sr->idx_ = uVar5;
  }
  bVar7 = false;
LAB_00339a73:
  if (local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar7;
}

Assistant:

bool AsciiParser::MaybeTripleQuotedString(value::StringData *str) {
  std::stringstream ss;

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  std::vector<char> triple_quote;
  if (!CharN(3, &triple_quote)) {
    SeekTo(loc);
    return false;
  }

  if (triple_quote.size() != 3) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = false;

  if (triple_quote[0] == '"' && triple_quote[1] == '"' &&
      triple_quote[2] == '"') {
    // ok
  } else if (triple_quote[0] == '\'' && triple_quote[1] == '\'' &&
             triple_quote[2] == '\'') {
    // ok
    single_quote = true;
  } else {
    SeekTo(loc);
    return false;
  }

  // Read until next triple-quote `"""` or "'''"
  std::stringstream str_buf;

  auto locinfo = _curr_cursor;

  int single_quote_count = 0;  // '
  int double_quote_count = 0;  // "

  bool got_closing_triple_quote{false};

  while (!Eof()) {
    char c;

    if (!Char1(&c)) {
      SeekTo(loc);
      return false;
    }

    // Seek \""" or \'''
    // Unescape '\'
    if (c == '\\') {
      std::vector<char> buf(3, '\0');
      if (!LookCharN(3, &buf)) {
        // at least 3 chars should be read
        return false;
      }

      if (buf[0] == '\'' && buf[1] == '\'' && buf[2] == '\'') {
        str_buf << "'''";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      } else if (buf[0] == '"' && buf[1] == '"' && buf[2] == '"') {
        str_buf << "\"\"\"";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      }
    }

    str_buf << c;

    if (c == '"') {
      double_quote_count++;
      single_quote_count = 0;
    } else if (c == '\'') {
      double_quote_count = 0;
      single_quote_count++;
    } else {
      double_quote_count = 0;
      single_quote_count = 0;
    }

    // Update loc info
    locinfo.col++;
    if (c == '\n') {
      locinfo.col = 0;
      locinfo.row++;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          SeekTo(loc);
          return false;
        }

        if (d == '\n') {
          // CRLF
          str_buf << d;
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            SeekTo(loc);
            return false;
          }
        }
      }
      locinfo.col = 0;
      locinfo.row++;
    }

    if (double_quote_count == 3) {
      // got '"""'
      if (single_quote) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
    if (single_quote_count == 3) {
      // got '''
      if (double_quote_count) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
  }

  if (!got_closing_triple_quote) {
    SeekTo(loc);
    return false;
  }

  DCOUT("single_quote = " << single_quote);
  DCOUT("Triple quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  // remove last '"""' or '''
  str->single_quote = single_quote;
  std::string s = str_buf.str();
  if (s.size() > 3) {  // just in case
    s.erase(s.size() - 3);
  }

  DCOUT("str = " << s);

  str->value = unescapeControlSequence(s);

  DCOUT("unescape str = " << str->value);

  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = true;

  _curr_cursor = locinfo;

  return true;
}